

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O0

Tab_Tab_t * Tab_TabAlloc(int LogSize)

{
  Tab_Tab_t *pTVar1;
  Tab_Obj_t_conflict *pTVar2;
  Tab_Tab_t *p;
  int LogSize_local;
  
  pTVar1 = (Tab_Tab_t *)calloc(1,0x10);
  if ((3 < LogSize) && (LogSize < 0x20)) {
    pTVar1->SizeMask = (1 << ((byte)LogSize & 0x1f)) + -1;
    pTVar2 = (Tab_Obj_t_conflict *)calloc((long)(pTVar1->SizeMask + 1),0x10);
    pTVar1->pBins = pTVar2;
    pTVar1->nBins = 1;
    return pTVar1;
  }
  __assert_fail("LogSize >= 4 && LogSize <= 31",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcFx.c"
                ,0x48,"Tab_Tab_t *Tab_TabAlloc(int)");
}

Assistant:

static inline Tab_Tab_t * Tab_TabAlloc( int LogSize )
{
    Tab_Tab_t * p = ABC_CALLOC( Tab_Tab_t, 1 );
    assert( LogSize >= 4 && LogSize <= 31 );
    p->SizeMask = (1 << LogSize) - 1;
    p->pBins = ABC_CALLOC( Tab_Obj_t, p->SizeMask + 1 );
    p->nBins = 1;
    return p;
}